

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O2

char * __thiscall CVmMemoryStream::read_line(CVmMemoryStream *this,char *buf,size_t len)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = (char *)0x0;
  if (((len != 0) && (buf != (char *)0x0)) && (pcVar3 = buf, this->p_ < this->buf_ + this->buflen_))
  {
    while( true ) {
      if ((len < 2) || (pcVar2 = this->p_, this->buf_ + this->buflen_ <= pcVar2)) goto LAB_001e8e1a;
      this->p_ = pcVar2 + 1;
      cVar1 = *pcVar2;
      if ((cVar1 == '\r') || (cVar1 == '\n')) break;
      *pcVar3 = cVar1;
      len = len - 1;
      pcVar3 = pcVar3 + 1;
    }
    *pcVar3 = '\n';
    pcVar2 = this->p_;
    if (pcVar2 < this->buf_ + this->buflen_) {
      if (cVar1 == '\r') {
        if (*pcVar2 == '\n') goto LAB_001e8e10;
      }
      else if ((cVar1 == '\n') && (*pcVar2 == '\r')) {
LAB_001e8e10:
        this->p_ = pcVar2 + 1;
      }
    }
    pcVar3 = pcVar3 + 1;
LAB_001e8e1a:
    *pcVar3 = '\0';
    pcVar2 = buf;
  }
  return pcVar2;
}

Assistant:

char *read_line(char *buf, size_t len)
    {
        /* if already at EOF, or there's no buffer, return null */
        if (p_ >= buf_ + buflen_ || buf == 0 || len == 0)
            return 0;

        /* read bytes until we fill the buffer or reach '\n' or EOF */
        char *dst;
        size_t rem;
        for (dst = buf, rem = len ; rem > 1 && p_ < buf_ + buflen_ ; --rem)
        {
            /* get this character */
            char c = *p_++;

            /* check for newlines */
            if (c == '\n' || c == '\r')
            {
                /* write CR and LF as simply CR */
                *dst++ = '\n';

                /* if we have a CR-LF or LF-CR sequence, skip the pair */
                if (p_ < buf_ + buflen_
                    && ((c == '\n' && *p_ == '\r')
                        || (c == '\r' && *p_ == '\n')))
                    p_ += 1;

                /* done */
                break;
            }

            /* copy this character */
            *dst++ = c;
        }

        /* add the trailing null and return the buffer */
        *dst = '\0';
        return buf;
    }